

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall
args::ActionFlag::ActionFlag
          (ActionFlag *this,Group *group_,string *name_,string *help_,Matcher *matcher_,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *action_,Options options_)

{
  _Any_data local_40;
  code *local_30;
  
  NamedBase::NamedBase((NamedBase *)this,name_,help_,options_);
  (this->super_FlagBase).super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&PTR__FlagBase_0021a720;
  Matcher::Matcher(&(this->super_FlagBase).matcher,matcher_);
  (this->super_FlagBase).super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&PTR__ActionFlag_0021cce8;
  *(undefined8 *)&(this->action).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->action).super__Function_base._M_functor + 8) = 0;
  (this->action).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->action)._M_invoker = (_Invoker_type)0x0;
  (this->nargs).min = 1;
  (this->nargs).max = 1;
  Group::Add(group_,(Base *)this);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_40,action_);
  std::function<void(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>
  ::operator=((function<void(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>
               *)&this->action,(anon_class_32_1_3e1a7bc9 *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return;
}

Assistant:

ActionFlag(Group &group_, const std::string &name_, const std::string &help_, Matcher &&matcher_, std::function<void(const std::string &)> action_, Options options_ = {}):
                FlagBase(name_, help_, std::move(matcher_), options_), nargs(1)
            {
                group_.Add(*this);
                action = [action_](const std::vector<std::string> &a) { return action_(a.at(0)); };
            }